

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::String::_opHex(String *this,ModifyOp op,void *data,size_t size,char separator)

{
  Error EVar1;
  ulong in_RCX;
  byte *in_RDX;
  size_t in_RDI;
  char in_R8B;
  String *unaff_retaddr;
  size_t i_1;
  size_t i;
  uint8_t *src;
  char *dst;
  ulong local_50;
  ulong local_48;
  byte *local_40;
  char *local_38;
  ModifyOp in_stack_fffffffffffffffc;
  
  if (in_RCX == 0) {
    return 0;
  }
  local_40 = in_RDX;
  if (in_R8B == '\0') {
    if (0x7ffffffffffffffe < in_RCX) {
      EVar1 = DebugUtils::errored(1);
      return EVar1;
    }
    local_38 = prepare(unaff_retaddr,in_stack_fffffffffffffffc,in_RDI);
    if (local_38 == (char *)0x0) {
      EVar1 = DebugUtils::errored(1);
      return EVar1;
    }
    for (local_50 = 0; local_50 < in_RCX; local_50 = local_50 + 1) {
      *local_38 = "0123456789ABCDEF"[(int)(uint)*local_40 >> 4];
      local_38[1] = "0123456789ABCDEF"[(int)(*local_40 & 0xf)];
      local_38 = local_38 + 2;
      local_40 = local_40 + 1;
    }
  }
  else {
    if (0x5555555555555554 < in_RCX) {
      EVar1 = DebugUtils::errored(1);
      return EVar1;
    }
    local_38 = prepare(unaff_retaddr,in_stack_fffffffffffffffc,in_RDI);
    if (local_38 == (char *)0x0) {
      EVar1 = DebugUtils::errored(1);
      return EVar1;
    }
    local_48 = 0;
    while( true ) {
      *local_38 = "0123456789ABCDEF"[(int)(uint)*local_40 >> 4];
      local_38[1] = "0123456789ABCDEF"[(int)(*local_40 & 0xf)];
      local_48 = local_48 + 1;
      if (local_48 == in_RCX) break;
      local_38[2] = in_R8B;
      local_38 = local_38 + 3;
      local_40 = local_40 + 1;
    }
  }
  return 0;
}

Assistant:

Error String::_opHex(ModifyOp op, const void* data, size_t size, char separator) noexcept {
  char* dst;
  const uint8_t* src = static_cast<const uint8_t*>(data);

  if (!size)
    return kErrorOk;

  if (separator) {
    if (ASMJIT_UNLIKELY(size >= SIZE_MAX / 3))
      return DebugUtils::errored(kErrorOutOfMemory);

    dst = prepare(op, size * 3 - 1);
    if (ASMJIT_UNLIKELY(!dst))
      return DebugUtils::errored(kErrorOutOfMemory);

    size_t i = 0;
    for (;;) {
      dst[0] = String_baseN[(src[0] >> 4) & 0xF];
      dst[1] = String_baseN[(src[0]     ) & 0xF];
      if (++i == size)
        break;
      // This makes sure that the separator is only put between two hexadecimal bytes.
      dst[2] = separator;
      dst += 3;
      src++;
    }
  }
  else {
    if (ASMJIT_UNLIKELY(size >= SIZE_MAX / 2))
      return DebugUtils::errored(kErrorOutOfMemory);

    dst = prepare(op, size * 2);
    if (ASMJIT_UNLIKELY(!dst))
      return DebugUtils::errored(kErrorOutOfMemory);

    for (size_t i = 0; i < size; i++, dst += 2, src++) {
      dst[0] = String_baseN[(src[0] >> 4) & 0xF];
      dst[1] = String_baseN[(src[0]     ) & 0xF];
    }
  }

  return kErrorOk;
}